

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O0

void see_wsegs(monst *worm)

{
  wseg *local_18;
  wseg *curr;
  monst *worm_local;
  
  local_18 = level->wtails[worm->wormno];
  if (worm->wormno == '\0') {
    warning("see_wsegs: worm->wormno was 0");
  }
  else {
    for (; local_18 != level->wheads[worm->wormno]; local_18 = local_18->nseg) {
      newsym((int)local_18->wx,(int)local_18->wy);
    }
  }
  return;
}

Assistant:

void see_wsegs(struct monst *worm)
{
    struct wseg *curr = level->wtails[worm->wormno];

    if (!worm->wormno) {
	warning("see_wsegs: worm->wormno was 0");
	return;
    }

    while (curr != level->wheads[worm->wormno]) {
	newsym(curr->wx,curr->wy);
	curr = curr->nseg;
    }
}